

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O2

vm_obj_id_t CVmObjHTTPServer::create_from_stack(uchar **pc_ptr,uint argc)

{
  long *plVar1;
  int iVar2;
  vm_obj_id_t obj_id;
  int32_t iVar3;
  CVmObjHTTPServer *this;
  TadsHttpListenerThread *this_00;
  TadsListener *pTVar4;
  char *pcVar5;
  ushort portno;
  vm_obj_id_t vVar6;
  long ulim;
  int server_level;
  int client_level;
  char addr [256];
  
  if (3 < argc) {
    err_throw(0x899);
  }
  memcpy(addr,"localhost",0x100);
  if (argc == 0) {
LAB_00208ddd:
    portno = 0;
LAB_00208ddf:
    ulim = 0;
  }
  else {
    if (sp_[-1].typ == VM_NIL) {
      sp_ = sp_ + -1;
    }
    else {
      CVmBif::pop_str_val_buf(addr,0x100);
    }
    if (argc == 1) goto LAB_00208ddd;
    if (sp_[-1].typ == VM_NIL) {
      sp_ = sp_ + -1;
      portno = 0;
    }
    else {
      iVar2 = CVmBif::pop_int_val();
      portno = (ushort)iVar2;
    }
    if (argc != 3) goto LAB_00208ddf;
    if (sp_[-1].typ == VM_NIL) {
      sp_ = sp_ + -1;
      goto LAB_00208ddf;
    }
    iVar3 = CVmBif::pop_long_val();
    ulim = (long)iVar3;
  }
  (*G_host_ifc_X->_vptr_CVmHostIfc[5])(G_host_ifc_X,&client_level,&server_level);
  if (server_level != 2) {
    if (server_level == 1) {
      iVar2 = stricmp(addr,"localhost");
      if (iVar2 != 0) {
        iVar2 = stricmp(addr,"127.0.0.1");
        if (iVar2 != 0) goto LAB_00208e36;
      }
    }
    obj_id = vm_new_id(0,0,0);
    *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 =
         *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 | 0x80;
    vVar6 = obj_id;
    this = (CVmObjHTTPServer *)CVmObject::operator_new(0x10,obj_id);
    CVmObjHTTPServer(this,vVar6);
    plVar1 = (long *)(this->super_CVmObject).ext_;
    this_00 = (TadsHttpListenerThread *)operator_new(0xa0);
    TadsHttpListenerThread::TadsHttpListenerThread(this_00,obj_id,G_net_queue_X,ulim);
    pTVar4 = TadsListener::launch(addr,portno,(TadsListenerThread *)this_00);
    *plVar1 = (long)pTVar4;
    CVmWeakRefable::release_ref((CVmWeakRefable *)this_00);
    if (*plVar1 == 0) {
      CVmRun::push_string(&G_interpreter_X,"Unable to start HTTP server");
      CVmRun::throw_new_class
                (&G_interpreter_X,G_predef_X.net_exception,1,"Unable to start HTTP server");
    }
    pcVar5 = lib_copy_str(addr);
    plVar1[1] = (long)pcVar5;
    return obj_id;
  }
LAB_00208e36:
  CVmRun::push_string(&G_interpreter_X,"prohibited network access");
  CVmRun::throw_new_class
            (&G_interpreter_X,G_predef_X.net_safety_exception,1,"prohibited network access");
}

Assistant:

vm_obj_id_t CVmObjHTTPServer::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    vm_obj_id_t id;
    const char *errmsg;

    /* 
     *   parse arguments - new HTTPServer(addr?, port?) 
     */
    if (argc > 3)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* check for the address - use "localhost" by default */
    char addr[256] = "localhost";
    if (argc >= 1)
    {
        /* get the address - this must be a string or nil */
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            CVmBif::pop_str_val_buf(vmg_ addr, sizeof(addr));
    }

    /* check for a port - use 0 by default */
    int port = 0;
    if (argc >= 2)
    {
        /* get the port number - this must be an integer or nil */
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            port = CVmBif::pop_int_val(vmg0_);
    }

    /* check for an upload size limit */
    int32_t ulim;
    if (argc >= 3)
    {
        if (G_stk->get(0)->typ == VM_NIL)
            G_stk->discard();
        else
            ulim = CVmBif::pop_long_val(vmg0_);
    }

    /* get the network safety level, to determine if this is allowed */
    int client_level, server_level;
    G_host_ifc->get_net_safety(&client_level, &server_level);

    /* check the network server safety level */
    switch (server_level)
    {
    case VM_NET_SAFETY_MINIMUM:
        /* all access allowed - proceed */
        break;

    case VM_NET_SAFETY_LOCALHOST:
        /* 
         *   localhost only - if the host isn't 'localhost' or '127.0.0.1',
         *   don't allow it 
         */
        if (stricmp(addr, "localhost") != 0
            && stricmp(addr, "127.0.0.1") != 0)
            goto access_error;

        /* allow it */
        break;

    case VM_NET_SAFETY_MAXIMUM:
    access_error:
        /* no access allowed */
        errmsg = "prohibited network access";
        G_interpreter->push_string(vmg_ errmsg);
        G_interpreter->throw_new_class(vmg_ G_predef->net_safety_exception,
                                       1, errmsg);
        AFTER_ERR_THROW(break;)
    }

    /* 
     *   allocate the object ID - this type of construction never creates a
     *   root object 
     */
    id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* http servers are inherently transient */
    G_obj_table->set_obj_transient(id);

    /* create the object */
    CVmObjHTTPServer *l = new (vmg_ id) CVmObjHTTPServer(vmg_ TRUE);

    /* get the extension */
    vm_httpsrv_ext *ext = l->get_ext();

    /* create the listener thread object */
    TadsHttpListenerThread *ht = new TadsHttpListenerThread(
        id, G_net_queue, ulim);

    /* launch the listener */
    ext->l = TadsListener::launch(addr, (ushort)port, ht);

    /* we're done with the thread object (the listener took it over) */
    ht->release_ref();

    /* if the launch failed, throw an error */
    if (ext->l == 0)
    {
        /* throw a network error */
        const char *errmsg = "Unable to start HTTP server";
        G_interpreter->push_string(vmg_ errmsg);
        G_interpreter->throw_new_class(vmg_ G_predef->net_exception, 1, errmsg);
    }

    /* remember my requested binding address */
    ext->addr = lib_copy_str(addr);

    /* return the new ID */
    return id;
}